

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void initialize_plugins(void)

{
  undefined *puVar1;
  vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_> *this;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  long lVar5;
  rep rVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  reference ppPVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  undefined1 auVar10 [16];
  Plugin **plugin;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_> *__range2_1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b8;
  duration<long,_std::ratio<1L,_1000000L>_> local_b0;
  double local_a8;
  double time_taken;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_98;
  bool load_success;
  time_point load_start;
  basic_string_view<char,_std::char_traits<char>_> *plugin_name;
  iterator __end2;
  iterator __begin2;
  container_type *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [8];
  container_type plugin_names;
  undefined8 local_30;
  size_t local_28;
  char *local_20;
  undefined1 local_18 [8];
  string_view plugin_list_str;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading plugins...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  puVar1 = Jupiter::g_config;
  bVar9 = sv("Plugins",7);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &plugin_names.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_28 = bVar9._M_len;
  local_20 = bVar9._M_str;
  auVar10 = Jupiter::Config::get
                      (puVar1,local_28,local_20,
                       plugin_names.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_30);
  plugin_list_str._M_len = auVar10._8_8_;
  local_18 = auVar10._0_8_;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_18);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"No plugins to load!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60," \t");
    jessilib::
    word_split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ((container_type *)local_50,
               (basic_string_view<char,_std::char_traits<char>_> *)local_18,&local_60);
    poVar3 = std::operator<<((ostream *)&std::cout,"Attempting to load ");
    sVar4 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_50);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    poVar3 = std::operator<<(poVar3," plugins...");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __end2 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_50);
    plugin_name = (basic_string_view<char,_std::char_traits<char>_> *)
                  std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)local_50);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        (&__end2,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  *)&plugin_name);
      this = Jupiter::plugins;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      load_start.__d.__r =
           (duration)
           __gnu_cxx::
           __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           ::operator*(&__end2);
      tStack_98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      lVar5 = Jupiter::Plugin::load((basic_string_view *)load_start.__d.__r);
      time_taken._7_1_ = lVar5 != 0;
      local_c0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_b8.__r = (rep)std::chrono::operator-(&local_c0,&stack0xffffffffffffff68);
      local_b0.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                    (&local_b8);
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_b0);
      local_a8 = (double)rVar6 / 1000.0;
      if ((time_taken._7_1_ & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"WARNING: Failed to load plugin \"");
        pbVar7 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,
                                 *(basic_string_view<char,_std::char_traits<char>_> *)
                                  load_start.__d.__r);
        poVar3 = std::operator<<((ostream *)pbVar7,"\" (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_a8);
        poVar3 = std::operator<<(poVar3,"ms)!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"\"");
        pbVar7 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,
                                 *(basic_string_view<char,_std::char_traits<char>_> *)
                                  load_start.__d.__r);
        poVar3 = std::operator<<((ostream *)pbVar7,"\" loaded successfully (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_a8);
        poVar3 = std::operator<<(poVar3,"ms).");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::begin
                         (Jupiter::plugins);
    plugin = (Plugin **)
             std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::end(this);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
                        (&__end2_1,
                         (__normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
                          *)&plugin);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppPVar8 = __gnu_cxx::
                __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
                ::operator*(&__end2_1);
      (**(code **)(*(long *)*ppPVar8 + 0x30))();
      __gnu_cxx::
      __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)local_50);
  }
  return;
}

Assistant:

void initialize_plugins() {
	std::cout << "Loading plugins..." << std::endl;
	std::string_view plugin_list_str = Jupiter::g_config->get("Plugins"sv);
	if (plugin_list_str.empty()) {
		std::cout << "No plugins to load!" << std::endl;
	}
	else {
		// initialize plugins
		auto plugin_names = jessilib::word_split_view(plugin_list_str, WHITESPACE_SV);
		std::cout << "Attempting to load " << plugin_names.size() << " plugins..." << std::endl;

		for (const auto& plugin_name : plugin_names) {
			std::chrono::steady_clock::time_point load_start = std::chrono::steady_clock::now();
			bool load_success = Jupiter::Plugin::load(plugin_name) != nullptr;
			double time_taken = static_cast<double>(std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - load_start).count()) / 1000.0;

			if (load_success) {
				std::cout << "\"" << plugin_name << "\" loaded successfully (" << time_taken << "ms)." << std::endl;
			}
			else {
				std::cerr << "WARNING: Failed to load plugin \"" << plugin_name << "\" (" << time_taken << "ms)!" << std::endl;
			}
		}

		// OnPostInitialize
		for (const auto& plugin : Jupiter::plugins) {
			plugin->OnPostInitialize();
		}
	}
}